

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O3

void duckdb::HeapGatherListVector
               (Vector *v,idx_t vcount,SelectionVector *sel,data_ptr_t *key_locations)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  LogicalType *other;
  VectorBuffer *pVVar7;
  idx_t iVar8;
  Vector *pVVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  SelectionVector *sel_00;
  long lVar12;
  data_ptr_t pdVar13;
  idx_t iVar14;
  ulong *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t source_size;
  idx_t idx_in_entry;
  ulong uVar19;
  unsigned_long next;
  LogicalType child_type;
  Vector append_vector;
  data_ptr_t list_entry_locations [2048];
  data_ptr_t local_4138;
  element_type *local_4128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4120;
  data_ptr_t local_4110;
  SelectionVector *local_4108;
  data_ptr_t *local_4100;
  LogicalType *local_40f8;
  ulong local_40f0;
  idx_t local_40e8;
  idx_t local_40e0;
  LogicalType local_40d8;
  idx_t local_40c0;
  LogicalType local_40b8;
  Vector local_40a0;
  data_ptr_t local_4038 [2049];
  
  local_4108 = sel;
  FlatVector::VerifyFlatVector(v);
  local_40f8 = &v->type;
  other = ListType::GetChildType(local_40f8);
  LogicalType::LogicalType(&local_40d8,other);
  VVar1 = v->vector_type;
  pVVar9 = v;
  while (VVar1 == DICTIONARY_VECTOR) {
    DictionaryVector::VerifyDictionary(pVVar9);
    pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar9->auxiliary);
    pVVar9 = (Vector *)(pVVar7 + 1);
    VVar1 = *(VectorType *)&pVVar7[1]._vptr_VectorBuffer;
  }
  local_4110 = pVVar9->data;
  iVar8 = ListVector::GetListSize(v);
  if (vcount != 0) {
    uVar17 = 0;
    local_4100 = key_locations;
    do {
      uVar19 = uVar17;
      if (local_4108->sel_vector != (sel_t *)0x0) {
        uVar19 = (ulong)local_4108->sel_vector[uVar17];
      }
      puVar2 = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) {
        puVar15 = (ulong *)key_locations[uVar17];
        uVar18 = *puVar15;
        *(ulong *)(local_4110 + uVar19 * 0x10 + 8) = uVar18;
        *(idx_t *)(local_4110 + uVar19 * 0x10) = iVar8;
        key_locations[uVar17] = (data_ptr_t)((long)puVar15 + (uVar18 + 7 >> 3) + 8);
        bVar6 = TypeIsConstantSize(local_40d8.physical_type_);
        if (bVar6) {
          local_4138 = (data_ptr_t)0x0;
        }
        else {
          local_4138 = key_locations[uVar17];
          key_locations[uVar17] = local_4138 + uVar18 * 8;
        }
        if (uVar18 != 0) {
          puVar15 = puVar15 + 1;
          lVar16 = 0;
          do {
            source_size = 0x800;
            if (uVar18 < 0x800) {
              source_size = uVar18;
            }
            local_40f0 = uVar18;
            local_40e8 = iVar8;
            local_40e0 = source_size;
            LogicalType::LogicalType(&local_40b8,local_40f8);
            Vector::Vector(&local_40a0,&local_40b8,0x800);
            LogicalType::~LogicalType(&local_40b8);
            Vector::SetVectorType(&local_40a0,v->vector_type);
            pVVar9 = ListVector::GetEntry(&local_40a0);
            FlatVector::VerifyFlatVector(pVVar9);
            _Var11._M_head_impl =
                 (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            uVar19 = 0;
            do {
              if (((byte)*puVar15 >> ((uint)lVar16 & 0x1f) & 1) == 0) {
                if (_Var11._M_head_impl == (unsigned_long *)0x0) {
                  local_40c0 = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_4128,&local_40c0);
                  p_Var5 = p_Stack_4120;
                  peVar4 = local_4128;
                  local_4128 = (element_type *)0x0;
                  p_Stack_4120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar4;
                  (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var5;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_4120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4120);
                  }
                  pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(pVVar9->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var11._M_head_impl =
                       (pTVar10->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var11._M_head_impl;
                }
                bVar3 = (byte)uVar19 & 0x3f;
                _Var11._M_head_impl[uVar19 >> 6] =
                     _Var11._M_head_impl[uVar19 >> 6] &
                     (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
              }
              else if (_Var11._M_head_impl == (unsigned_long *)0x0) {
                _Var11._M_head_impl = (unsigned_long *)0x0;
              }
              else {
                _Var11._M_head_impl[uVar19 >> 6] =
                     _Var11._M_head_impl[uVar19 >> 6] | 1L << ((byte)uVar19 & 0x3f);
              }
              lVar12 = lVar16 + 1;
              lVar16 = 0;
              if (lVar12 != 8) {
                lVar16 = lVar12;
              }
              puVar15 = (ulong *)((long)puVar15 + (ulong)(lVar12 == 8));
              uVar19 = uVar19 + 1;
            } while (source_size != uVar19);
            bVar6 = TypeIsConstantSize(local_40d8.physical_type_);
            key_locations = local_4100;
            if (bVar6) {
              iVar8 = GetTypeIdSize(local_40d8.physical_type_);
              pdVar13 = key_locations[uVar17];
              iVar14 = 0;
              do {
                local_4038[iVar14] = pdVar13;
                pdVar13 = pdVar13 + iVar8;
                iVar14 = iVar14 + 1;
              } while (source_size != iVar14);
              key_locations[uVar17] = pdVar13;
            }
            else {
              pdVar13 = local_4100[uVar17];
              lVar12 = 0;
              do {
                *(data_ptr_t *)((long)local_4038 + lVar12) = pdVar13;
                pdVar13 = pdVar13 + *(long *)(local_4138 + lVar12);
                local_4100[uVar17] = pdVar13;
                lVar12 = lVar12 + 8;
              } while (source_size * 8 - lVar12 != 0);
              local_4138 = local_4138 + lVar12;
            }
            sel_00 = FlatVector::IncrementalSelectionVector();
            RowOperations::HeapGather
                      (pVVar9,&local_40e0,sel_00,local_4038,
                       (optional_ptr<duckdb::NestedValidity,_true>)0x0);
            ListVector::Append(v,pVVar9,source_size,0);
            if (local_40a0.auxiliary.internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40a0.auxiliary.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_40a0.buffer.internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40a0.buffer.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_40a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40a0.validity.super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            uVar18 = local_40f0 - source_size;
            iVar8 = local_40e8 + source_size;
            LogicalType::~LogicalType(&local_40a0.type);
          } while (uVar18 != 0);
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != vcount);
  }
  LogicalType::~LogicalType(&local_40d8);
  return;
}

Assistant:

static void HeapGatherListVector(Vector &v, const idx_t vcount, const SelectionVector &sel, data_ptr_t *key_locations) {
	const auto &validity = FlatVector::Validity(v);

	auto child_type = ListType::GetChildType(v.GetType());
	auto list_data = ListVector::GetData(v);
	data_ptr_t list_entry_locations[STANDARD_VECTOR_SIZE];

	uint64_t entry_offset = ListVector::GetListSize(v);
	for (idx_t i = 0; i < vcount; i++) {
		const auto col_idx = sel.get_index(i);
		if (!validity.RowIsValid(col_idx)) {
			continue;
		}
		// read list length
		auto entry_remaining = Load<uint64_t>(key_locations[i]);
		key_locations[i] += sizeof(uint64_t);
		// set list entry attributes
		list_data[col_idx].length = entry_remaining;
		list_data[col_idx].offset = entry_offset;
		// skip over the validity mask
		data_ptr_t validitymask_location = key_locations[i];
		idx_t offset_in_byte = 0;
		key_locations[i] += (entry_remaining + 7) / 8;
		// entry sizes
		data_ptr_t var_entry_size_ptr = nullptr;
		if (!TypeIsConstantSize(child_type.InternalType())) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += entry_remaining * sizeof(idx_t);
		}

		// now read the list data
		while (entry_remaining > 0) {
			auto next = MinValue(entry_remaining, (idx_t)STANDARD_VECTOR_SIZE);

			// initialize a new vector to append
			Vector append_vector(v.GetType());
			append_vector.SetVectorType(v.GetVectorType());

			auto &list_vec_to_append = ListVector::GetEntry(append_vector);

			// set validity
			//! Since we are constructing the vector, this will always be a flat vector.
			auto &append_validity = FlatVector::Validity(list_vec_to_append);
			for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
				append_validity.Set(entry_idx, *(validitymask_location) & (1 << offset_in_byte));
				if (++offset_in_byte == 8) {
					validitymask_location++;
					offset_in_byte = 0;
				}
			}

			// compute entry sizes and set locations where the list entries are
			if (TypeIsConstantSize(child_type.InternalType())) {
				// constant size list entries
				const idx_t type_size = GetTypeIdSize(child_type.InternalType());
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += type_size;
				}
			} else {
				// variable size list entries
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += Load<idx_t>(var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			}

			// now deserialize and add to listvector
			RowOperations::HeapGather(list_vec_to_append, next, *FlatVector::IncrementalSelectionVector(),
			                          list_entry_locations, nullptr);
			ListVector::Append(v, list_vec_to_append, next);

			// update for next iteration
			entry_remaining -= next;
			entry_offset += next;
		}
	}
}